

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O3

_Bool COSE_Sign_Sign(HCOSE_SIGN h,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor *pcborBody;
  cn_cbor *pcborProtected;
  COSE_SignerInfo *pSigner;
  
  if ((h == (HCOSE_SIGN)0x0) || (_Var1 = _COSE_IsInList(SignRoot,(COSE *)h), !_Var1)) {
    cVar2 = COSE_ERR_INVALID_HANDLE;
  }
  else {
    pcborBody = _COSE_arrayget_int((COSE *)h,2);
    if ((pcborBody != (cn_cbor *)0x0) && (pcborBody->type == CN_CBOR_BYTES)) {
      pcborProtected = _COSE_encode_protected((COSE *)h,perr);
      if (pcborProtected == (cn_cbor *)0x0) {
        return false;
      }
      pSigner = *(COSE_SignerInfo **)(h + 0x58);
      if (pSigner != (COSE_SignerInfo *)0x0) {
        do {
          _Var1 = _COSE_Signer_sign(pSigner,pcborBody,pcborProtected,perr);
          if (!_Var1) {
            return _Var1;
          }
          pSigner = pSigner->m_signerNext;
        } while (pSigner != (COSE_SignerInfo *)0x0);
        return _Var1;
      }
      return true;
    }
    cVar2 = COSE_ERR_INVALID_PARAMETER;
  }
  if (perr != (cose_errback *)0x0) {
    perr->err = cVar2;
  }
  return false;
}

Assistant:

bool COSE_Sign_Sign(HCOSE_SIGN h, cose_errback * perr)
{
#ifdef USE_CBOR_CONTEXT
  // cn_cbor_context * context = NULL;
#endif
	COSE_SignMessage * pMessage = (COSE_SignMessage *)h;
	COSE_SignerInfo * pSigner;
	const cn_cbor * pcborBody;
	const cn_cbor * pcborProtected;

	if (!IsValidSignHandle(h)) {
		CHECK_CONDITION(false, COSE_ERR_INVALID_HANDLE);
	errorReturn:
		return false;
	}
#ifdef USE_CBOR_CONTEXT
	//	context = &pMessage->m_message.m_allocContext;
#endif

	pcborBody = _COSE_arrayget_int(&pMessage->m_message, INDEX_BODY);
	CHECK_CONDITION((pcborBody != NULL) && (pcborBody->type == CN_CBOR_BYTES), COSE_ERR_INVALID_PARAMETER);

	pcborProtected = _COSE_encode_protected(&pMessage->m_message, perr);
	if (pcborProtected == NULL) goto errorReturn;

	for (pSigner = pMessage->m_signerFirst; pSigner != NULL; pSigner = pSigner->m_signerNext) {
		if (!_COSE_Signer_sign(pSigner, pcborBody, pcborProtected, perr)) goto errorReturn;
	}

	return true;
}